

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

double sexp_ratio_to_double(sexp ctx,sexp rat)

{
  int *piVar1;
  int *piVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  sexp psVar6;
  long in_RSI;
  sexp in_RDI;
  sexp unaff_retaddr;
  sexp in_stack_00000008;
  sexp in_stack_00000010;
  double res;
  sexp den;
  sexp num;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp quot;
  sexp ctx_00;
  double local_48;
  sexp in_stack_ffffffffffffffc0;
  sexp_gc_var_t local_28;
  sexp local_18;
  long local_10;
  
  local_18 = (sexp)0x43e;
  local_10 = in_RSI;
  memset(&local_28,0,0x10);
  piVar1 = *(int **)(local_10 + 8);
  piVar2 = *(int **)(local_10 + 0x10);
  if ((((ulong)piVar1 & 3) == 0) && (*piVar1 == 0xc)) {
    local_48 = sexp_bignum_to_double(in_stack_ffffffffffffffc0);
  }
  else {
    auVar3._8_8_ = (long)piVar1 >> 0x3f;
    auVar3._0_8_ = (ulong)piVar1 & 0xfffffffffffffffe;
    local_48 = (double)SUB168(auVar3 / SEXT816(2),0);
  }
  if ((((ulong)piVar2 & 3) == 0) && (*piVar2 == 0xc)) {
    ctx_00 = (sexp)sexp_bignum_to_double(in_stack_ffffffffffffffc0);
  }
  else {
    auVar4._8_8_ = (long)piVar2 >> 0x3f;
    auVar4._0_8_ = (ulong)piVar2 & 0xfffffffffffffffe;
    ctx_00 = (sexp)(double)SUB168(auVar4 / SEXT816(2),0);
  }
  local_48 = local_48 / (double)ctx_00;
  if (0x7fefffffffffffff < (ulong)ABS(local_48)) {
    local_28.var = &local_18;
    local_28.next = (in_RDI->value).context.saves;
    (in_RDI->value).context.saves = &local_28;
    psVar6 = sexp_compare(den,(sexp)res,in_stack_00000010);
    auVar5._8_8_ = (long)psVar6 >> 0x3f;
    auVar5._0_8_ = (ulong)psVar6 & 0xfffffffffffffffe;
    if (SUB168(auVar5 / SEXT816(2),0) < 0) {
      local_18 = sexp_quotient(in_stack_00000008,unaff_retaddr,in_RDI);
      local_48 = sexp_to_double(ctx_00,(sexp)0x12db44);
      local_48 = 1.0 / local_48;
    }
    else {
      local_18 = sexp_quotient(in_stack_00000008,unaff_retaddr,in_RDI);
      local_48 = sexp_to_double(ctx_00,(sexp)0x12db8b);
    }
    (in_RDI->value).context.saves = local_28.next;
  }
  return local_48;
}

Assistant:

double sexp_ratio_to_double (sexp ctx, sexp rat) {
  sexp_gc_var1(quot);
  sexp num = sexp_ratio_numerator(rat), den = sexp_ratio_denominator(rat);
  double res = (sexp_bignump(num) ? sexp_bignum_to_double(num)
          : sexp_fixnum_to_double(num))
    / (sexp_bignump(den) ? sexp_bignum_to_double(den)
       : sexp_fixnum_to_double(den));
  if (!isfinite(res)) {
    sexp_gc_preserve1(ctx, quot);
    if (sexp_unbox_fixnum(sexp_compare(ctx, sexp_ratio_numerator(rat),  sexp_ratio_denominator(rat))) < 0) {
      quot = sexp_quotient(ctx, sexp_ratio_denominator(rat),  sexp_ratio_numerator(rat));
      res = 1 / sexp_to_double(ctx, quot);
    } else {
      quot = sexp_quotient(ctx, sexp_ratio_numerator(rat),  sexp_ratio_denominator(rat));
      res = sexp_to_double(ctx, quot);
    }
    sexp_gc_release1(ctx);
  }
  return res;
}